

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary.h
# Opt level: O3

ssize_t bandit::reporter::summary::write(int __fd,void *__buf,size_t __n)

{
  ostream *poVar1;
  long *extraout_RAX;
  ostream *poVar2;
  long lVar3;
  long *plVar4;
  int in_ECX;
  undefined4 in_register_0000003c;
  int in_R8D;
  undefined8 *in_R9;
  int iVar5;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  undefined8 *puVar6;
  long *in_stack_00000008;
  long *in_stack_00000010;
  long *local_80;
  long local_78;
  long local_70 [2];
  int local_5c;
  int local_58;
  int local_54;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  poVar1 = (ostream *)CONCAT44(in_register_0000003c,__fd);
  local_5c = (int)__buf;
  lVar3 = in_stack_00000008[2];
  if (lVar3 == 0 && local_5c == 0) {
    (**(code **)(*in_stack_00000010 + 0x28))(&local_50,in_stack_00000010);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_50,local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Could not find any tests.",0x19);
    (**(code **)(*in_stack_00000010 + 0x38))(&local_80,in_stack_00000010);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_80,local_78);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if (local_80 != local_70) {
      operator_delete(local_80,local_70[0] + 1);
    }
    plVar4 = local_40;
    if (local_50 != plVar4) {
      operator_delete(local_50,local_40[0] + 1);
      plVar4 = extraout_RAX;
    }
  }
  else {
    iVar5 = (int)__n;
    local_58 = in_ECX;
    local_54 = in_R8D;
    if (iVar5 == 0 && lVar3 == 0) {
      (**(code **)(*in_stack_00000010 + 0x10))(&local_50);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_50,local_48);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Success!",8);
      (**(code **)(*in_stack_00000010 + 0x38))(&local_80);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_80,local_78);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if (local_80 != local_70) {
        operator_delete(local_80,local_70[0] + 1);
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      lVar3 = in_stack_00000008[2];
    }
    plVar4 = (long *)*in_stack_00000008;
    if (plVar4 != in_stack_00000008 && lVar3 != 0) {
      do {
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar1,(char *)plVar4[2],plVar4[3]);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        plVar4 = (long *)*plVar4;
      } while (plVar4 != in_stack_00000008);
    }
    if (0 < iVar5) {
      (**(code **)(*in_stack_00000010 + 0x28))(&local_50,in_stack_00000010);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_50,local_48);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"There were failures!",0x14);
      (**(code **)(*in_stack_00000010 + 0x38))(&local_80,in_stack_00000010);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_80,local_78);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if (local_80 != local_70) {
        operator_delete(local_80,local_70[0] + 1);
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      for (puVar6 = (undefined8 *)*in_R9; puVar6 != in_R9; puVar6 = (undefined8 *)*puVar6) {
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar1,(char *)puVar6[2],puVar6[3]);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Test run complete. ",0x13);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar1,local_5c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," tests run. ",0xc);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," succeeded.",0xb);
    if (0 < local_54) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar1,local_54);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," skipped.",9);
    }
    if (0 < iVar5) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar1,iVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," failed.",8);
    }
    if (in_stack_00000008[2] != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," test run errors.",0x11);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)__fd);
    std::ostream::put((char)__fd);
    plVar4 = (long *)std::ostream::flush();
  }
  return (ssize_t)plVar4;
}

Assistant:

static void write(std::ostream& stm,
          int specs_run, int specs_failed, int specs_succeeded, int specs_skipped,
          const std::list<std::string>& failures, const std::list<std::string>& errors,
          const detail::colorizer_t& colorizer) {
        if (specs_run == 0 && errors.size() == 0) {
          stm << colorizer.bad()
              << "Could not find any tests."
              << colorizer.reset()
              << std::endl;
          return;
        }

        if (specs_failed == 0 && errors.size() == 0) {
          stm << colorizer.good()
              << "Success!"
              << colorizer.reset()
              << std::endl;
        }

        if (errors.size() > 0) {
          for (const auto& error : errors) {
            stm << error << std::endl;
          }
        }

        if (specs_failed > 0) {
          stm << colorizer.bad()
              << "There were failures!"
              << colorizer.reset() << std::endl;
          for (const auto& failure : failures) {
            stm << failure << std::endl;
          }
        }

        stm << "Test run complete. "
            << specs_run << " tests run. "
            << specs_succeeded << " succeeded.";

        if (specs_skipped > 0) {
          stm << " " << specs_skipped << " skipped.";
        }

        if (specs_failed > 0) {
          stm << " " << specs_failed << " failed.";
        }

        if (errors.size() > 0) {
          stm << " " << errors.size() << " test run errors.";
        }

        stm << std::endl;
      }